

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_script.cpp
# Opt level: O0

void __thiscall
cfdcapi_script_TapscriptTreeAddTreeString_Test::TestBody
          (cfdcapi_script_TapscriptTreeAddTreeString_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  char *str_buffer;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  char *tree_str;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  uint32_t branch_count;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  void *tree_handle1;
  int tmp_ret;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc68;
  AssertionResult *in_stack_fffffffffffffc70;
  AssertionResult *pAVar5;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  char *in_stack_fffffffffffffc80;
  AssertionResult *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  AssertionResult *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  undefined7 in_stack_fffffffffffffd20;
  uint32_t *in_stack_fffffffffffffd28;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  char **in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd68;
  AssertHelper local_268;
  Message local_260;
  undefined4 local_254;
  AssertionResult local_250;
  AssertHelper local_240;
  Message local_238;
  AssertionResult local_230;
  AssertHelper local_220;
  Message local_218;
  undefined4 local_20c;
  AssertionResult local_208;
  char *local_1f8;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  uint8_t in_stack_fffffffffffffe47;
  char *in_stack_fffffffffffffe48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  AssertHelper in_stack_fffffffffffffe58;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  char *local_180;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  AssertHelper in_stack_fffffffffffffeb0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb8;
  AssertionResult local_138;
  undefined4 local_124;
  AssertHelper local_120;
  Message local_118;
  undefined4 local_10c;
  AssertionResult local_108;
  AssertHelper local_f8;
  Message local_f0;
  undefined4 local_e4;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  undefined8 local_a8;
  int local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)in_stack_fffffffffffffc88);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (int *)in_stack_fffffffffffffc70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b149a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2ba,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3b14fd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1552);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,(type *)0x3b1586);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,699,pcVar4);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3b1682);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b16fd);
  local_9c = 0;
  local_a8 = 0;
  local_14 = CfdInitializeTaprootScriptTree
                       (in_stack_fffffffffffffd58,
                        (void **)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  local_bc = 0;
  pAVar5 = &local_b8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (int *)in_stack_fffffffffffffc70);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_c8);
    in_stack_fffffffffffffd58 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3b17dd);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2c0,(char *)in_stack_fffffffffffffd58);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x3b1840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1898);
  if (local_14 == 0) {
    local_14 = CfdSetInitialTapLeaf
                         (in_stack_fffffffffffffe58.data_,in_stack_fffffffffffffe50.ptr_,
                          in_stack_fffffffffffffe48,in_stack_fffffffffffffe47);
    local_e4 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b197b);
      testing::internal::AssertHelper::AssertHelper
                (&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2c5,pcVar4);
      testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_f8);
      testing::Message::~Message((Message *)0x3b19de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1a36);
    local_14 = CfdAddTapBranchByScriptTreeString
                         (in_stack_fffffffffffffeb8.ptr_,in_stack_fffffffffffffeb0.data_,
                          (char *)in_stack_fffffffffffffea8.ptr_);
    local_10c = 0;
    this_00 = &local_108;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!(bool)uVar3) {
      testing::Message::Message(&local_118);
      in_stack_fffffffffffffd28 =
           (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3b1b06);
      testing::internal::AssertHelper::AssertHelper
                (&local_120,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2c9,(char *)in_stack_fffffffffffffd28);
      testing::internal::AssertHelper::operator=(&local_120,&local_118);
      testing::internal::AssertHelper::~AssertHelper(&local_120);
      testing::Message::~Message((Message *)0x3b1b69);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1bc1);
    local_124 = 0;
    local_14 = CfdGetTapBranchCount
                         ((void *)CONCAT17(uVar3,in_stack_fffffffffffffd38),this_00,
                          in_stack_fffffffffffffd28);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!(bool)uVar3) {
      testing::Message::Message((Message *)&stack0xfffffffffffffeb8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b1c9d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffeb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2cd,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffeb0,(Message *)&stack0xfffffffffffffeb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
      testing::Message::~Message((Message *)0x3b1d00);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1d55);
    local_164 = 1;
    in_stack_fffffffffffffd00 = (AssertionResult *)&stack0xfffffffffffffea0;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (int *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (uint *)in_stack_fffffffffffffc70);
    in_stack_fffffffffffffd0f =
         testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd00);
    if (!(bool)in_stack_fffffffffffffd0f) {
      testing::Message::Message(&local_170);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b1e02);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2ce,pcVar4);
      testing::internal::AssertHelper::operator=(&local_178,&local_170);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      testing::Message::~Message((Message *)0x3b1e65);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b1ebd);
    local_180 = (char *)0x0;
    local_14 = CfdGetTaprootScriptTreeSrting
                         ((void *)CONCAT17(uVar2,in_stack_fffffffffffffd68),pAVar5,
                          in_stack_fffffffffffffd58);
    local_194 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b1f9a);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffe58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2d2,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffe58,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe58);
      testing::Message::~Message((Message *)0x3b1ff7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b204c);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffe48,
                 "\"{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}\""
                 ,"tree_str",
                 "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}"
                 ,local_180);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe48);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffe40);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b20ef);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                   ,0x2d6,pcVar4);
        testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&stack0xfffffffffffffe40);
        testing::internal::AssertHelper::~AssertHelper(&local_1c8);
        testing::Message::~Message((Message *)0x3b214c);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b21a1);
      CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
      local_180 = (char *)0x0;
    }
    local_9c = CfdFreeTaprootScriptTreeHandle
                         (in_stack_fffffffffffffd28,
                          (void *)CONCAT17(uVar3,in_stack_fffffffffffffd20));
    local_1dc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b2279);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2dc,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x3b22d6);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b232b);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffcaf,
                                                  in_stack_fffffffffffffca8));
  if (local_14 != 0) {
    local_1f8 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                          (char **)in_stack_fffffffffffffd00);
    local_20c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
               (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (int *)in_stack_fffffffffffffc70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
    if (!bVar1) {
      testing::Message::Message(&local_218);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b2418);
      testing::internal::AssertHelper::AssertHelper
                (&local_220,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2e3,pcVar4);
      testing::internal::AssertHelper::operator=(&local_220,&local_218);
      testing::internal::AssertHelper::~AssertHelper(&local_220);
      testing::Message::~Message((Message *)0x3b2475);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b24ca);
    in_stack_fffffffffffffc88 = &local_230;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffffc88,"\"\"","str_buffer","",local_1f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc88);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      in_stack_fffffffffffffc80 =
           testing::AssertionResult::failure_message((AssertionResult *)0x3b255f);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
                 ,0x2e4,in_stack_fffffffffffffc80);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x3b25bc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2611);
    CfdFreeStringBuffer((char *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
    local_1f8 = (char *)0x0;
  }
  local_14 = CfdFreeHandle((void *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
  local_254 = 0;
  pAVar5 = &local_250;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            (&in_stack_fffffffffffffc88->success_,in_stack_fffffffffffffc80,
             (CfdErrorCode *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (int *)pAVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar5);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3b26e1);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_script.cpp"
               ,0x2ea,pcVar4);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message((Message *)0x3b273c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3b2791);
  return;
}

Assistant:

TEST(cfdcapi_script, TapscriptTreeAddTreeString) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int tmp_ret = 0;
  void* tree_handle1 = nullptr;
  ret = CfdInitializeTaprootScriptTree(handle, &tree_handle1);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdSetInitialTapLeaf(handle, tree_handle1,
        "2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac",
        0xc0);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdAddTapBranchByScriptTreeString(handle, tree_handle1,
        "{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)}");
    EXPECT_EQ(kCfdSuccess, ret);

    uint32_t branch_count = 0;
    ret = CfdGetTapBranchCount(handle, tree_handle1, &branch_count);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, branch_count);

    char* tree_str = nullptr;
    ret = CfdGetTaprootScriptTreeSrting(handle, tree_handle1, &tree_str);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(
        "{{tl(20ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440ac),tl(51)},tl(2057bf643684f6c5c75e1cdf45990036502a0d897394013210858cdabcbb95a05aad205bec1a08fa3443176edd0a08e2a64642f45e57543b62bffe43ec350edc33dc22ac)}",
        tree_str);
      CfdFreeStringBuffer(tree_str);
      tree_str = nullptr;
    }

    tmp_ret = CfdFreeTaprootScriptTreeHandle(handle, tree_handle1);
    EXPECT_EQ(kCfdSuccess, tmp_ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}